

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,signed_char>
          (TryCast *this,string_t input,int8_t *result,bool strict)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char cVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  idx_t iVar16;
  bool bVar17;
  ExponentData exponent;
  byte local_88;
  IntegerDecimalCastData<signed_char> local_78;
  byte *local_58;
  ulong local_50;
  ulong local_48;
  string_t input_local;
  
  local_58 = input.value._8_8_;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar14 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar14 = input_local.value.pointer.prefix;
  }
  uVar5 = (ulong)this & 0xffffffff;
  uVar15 = 0;
  while( true ) {
    uVar8 = uVar5 - uVar15;
    local_88 = (byte)result;
    input_local.value._0_8_ = this;
    if (uVar8 == 0) break;
    bVar3 = pcVar14[uVar15];
    if ((4 < bVar3 - 9) && (bVar3 != 0x20)) {
      if (bVar3 == 0x2d) {
        uVar9 = uVar5 - uVar15;
        bVar3 = 0;
        uVar8 = 1;
        goto LAB_002406f8;
      }
      if ((uVar5 - 1 == uVar15) || (bVar3 != 0x30)) {
        if ((local_88 & bVar3 == 0x2b) == 0) {
          uVar9 = (ulong)(bVar3 == 0x2b);
LAB_002408f3:
          bVar3 = 0;
          uVar13 = uVar9;
          goto LAB_00240901;
        }
        break;
      }
      cVar10 = pcVar14[uVar15 + 1];
      if (cVar10 == 'B') {
LAB_002409f2:
        uVar8 = ~uVar15 + uVar5;
        uVar13 = 1;
        bVar3 = 0;
        goto LAB_00240a00;
      }
      if (cVar10 != 'x') {
        if (cVar10 == 'b') goto LAB_002409f2;
        if (cVar10 != 'X') {
          if ((local_88 & (byte)(cVar10 - 0x30U) < 10) == 0) {
            uVar9 = 0;
            goto LAB_002408f3;
          }
          break;
        }
      }
      local_50 = ~uVar15 + uVar5;
      bVar3 = 0;
      uVar13 = 1;
      goto LAB_002407f2;
    }
    uVar15 = uVar15 + 1;
  }
LAB_00240bb9:
  for (uVar15 = 0; uVar8 = uVar5 - uVar15, uVar8 != 0; uVar15 = uVar15 + 1) {
    bVar3 = pcVar14[uVar15];
    if ((0x20 < (ulong)bVar3) || ((0x100003e00U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
      local_78._16_8_ = 0;
      local_78.result = 0;
      local_78.decimal = 0;
      if (bVar3 == 0x2d) {
        local_78.result = 0;
        uVar9 = 1;
        goto LAB_00240c0d;
      }
      if ((uVar5 - 1 != uVar15) && (bVar3 == 0x30)) {
        cVar10 = pcVar14[uVar15 + 1];
        if (cVar10 == 'B') {
LAB_00240f6c:
          local_78.result = 0;
          uVar8 = 1;
          goto LAB_00240f87;
        }
        if (cVar10 != 'x') {
          if (cVar10 == 'b') goto LAB_00240f6c;
          if (cVar10 != 'X') {
            if ((local_88 & (byte)(cVar10 - 0x30U) < 10) != 0) {
              return false;
            }
            uVar9 = 0;
            goto LAB_00240de0;
          }
        }
        lVar12 = 0;
        uVar8 = 1;
        goto LAB_00240cfa;
      }
      if ((local_88 & bVar3 == 0x2b) == 0) {
        uVar9 = (ulong)(bVar3 == 0x2b);
LAB_00240de0:
        local_78.result = 0;
        uVar13 = uVar9;
        goto LAB_00240deb;
      }
      break;
    }
  }
  goto LAB_002413a7;
LAB_002406f8:
  uVar13 = uVar8;
  if (uVar9 <= uVar13) goto joined_r0x00240ba2;
  bVar11 = pcVar14[uVar15 + uVar13];
  if (9 < (byte)(bVar11 - 0x30)) {
    if (bVar11 == 0x2e) {
      if (local_88 != 0) goto LAB_00240bb9;
      if (uVar9 <= uVar13 + 1) goto joined_r0x00240ba2;
      if ((uVar13 < 2) ||
         (bVar11 = pcVar14[uVar15 + 1 + uVar13], uVar13 = uVar13 + 1, (byte)(bVar11 - 0x30) < 10))
      goto LAB_00240bb9;
    }
    if ((bVar11 < 0x21) && ((0x100003e00U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) {
      uVar8 = uVar13 + 1;
      uVar13 = uVar8;
      if (uVar8 < uVar9) {
        uVar13 = uVar9;
      }
      goto LAB_00240ab2;
    }
    goto LAB_00240bb9;
  }
  bVar2 = (byte)(0xb0 - bVar11) / 10;
  if ((SBORROW1(bVar3,-bVar2) != (char)(bVar3 + bVar2) < '\0') ||
     (((bVar3 = (bVar3 * '\n' - bVar11) + 0x30, uVar8 = uVar9, ~uVar13 + uVar5 != uVar15 &&
       (uVar8 = uVar13 + 1, pcVar14[uVar15 + 1 + uVar13] == '_' && local_88 == 0)) &&
      (((uVar5 - uVar13) - 2 == uVar15 ||
       (uVar8 = uVar13 + 2, 9 < (byte)(pcVar14[uVar15 + 2 + uVar13] - 0x30U)))))))
  goto LAB_00240bb9;
  goto LAB_002406f8;
LAB_00240ab2:
  if (uVar9 <= uVar8) goto joined_r0x00240ba2;
  if ((0x20 < (ulong)(byte)pcVar14[uVar15 + uVar8]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar15 + uVar8] & 0x3f) & 1) == 0)) goto LAB_00240bb9;
  uVar8 = uVar8 + 1;
  goto LAB_00240ab2;
LAB_00240a00:
  if (uVar8 <= uVar13) goto joined_r0x00240ba2;
  if (pcVar14[uVar15 + 1 + uVar13] == '0') {
    bVar11 = 0;
  }
  else {
    if (pcVar14[uVar15 + 1 + uVar13] != '1') goto LAB_00240bb9;
    bVar11 = 1;
  }
  uVar9 = uVar8;
  if ((uVar5 - uVar13) - 2 != uVar15) {
    if (pcVar14[uVar15 + 2 + uVar13] == '_') {
      if (((uVar5 - uVar13) - 3 == uVar15) || ((pcVar14[uVar15 + 3 + uVar13] & 0xfeU) != 0x30))
      goto LAB_00240bb9;
      uVar9 = uVar13 + 2;
    }
    else {
      uVar9 = uVar13 + 1;
    }
  }
  uVar13 = uVar9;
  if ('?' < (char)bVar3) goto LAB_00240bb9;
  bVar3 = bVar11 | bVar3 * '\x02';
  goto LAB_00240a00;
LAB_00240901:
  uVar4 = uVar13;
  if (uVar8 <= uVar4) goto LAB_00240aeb;
  bVar11 = pcVar14[uVar15 + uVar4];
  if (9 < (byte)(bVar11 - 0x30)) {
    if (bVar11 == 0x2e) {
      if (local_88 != 0) goto LAB_00240bb9;
      uVar13 = uVar4 + 1;
      if (uVar8 <= uVar13) {
        bVar17 = uVar9 < uVar4;
        uVar4 = uVar13;
        if (bVar17) goto LAB_00240aeb;
        goto LAB_00240bb9;
      }
      if ((uVar4 <= uVar9) ||
         (bVar11 = pcVar14[uVar15 + 1 + uVar4], uVar4 = uVar13, (byte)(bVar11 - 0x30) < 10))
      goto LAB_00240bb9;
    }
    if ((bVar11 < 0x21) && ((0x100003e00U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) {
      uVar13 = uVar4 + 1;
      uVar4 = uVar13;
      if (uVar13 < uVar8) {
        uVar4 = uVar8;
      }
      goto LAB_00240b7b;
    }
    goto LAB_00240bb9;
  }
  if (((char)((byte)(0xaf - bVar11) / 10) < (char)bVar3) ||
     (((bVar3 = (bVar11 - 0x30) + bVar3 * '\n', uVar13 = uVar8, ~uVar4 + uVar5 != uVar15 &&
       (uVar13 = uVar4 + 1, pcVar14[uVar15 + 1 + uVar4] == '_' && local_88 == 0)) &&
      (((uVar5 - uVar4) - 2 == uVar15 ||
       (uVar13 = uVar4 + 2, 9 < (byte)(pcVar14[uVar15 + 2 + uVar4] - 0x30U))))))) goto LAB_00240bb9;
  goto LAB_00240901;
LAB_00240b7b:
  if (uVar8 <= uVar13) goto LAB_00240aeb;
  if ((0x20 < (ulong)(byte)pcVar14[uVar15 + uVar13]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar15 + uVar13] & 0x3f) & 1) == 0)) goto LAB_00240bb9;
  uVar13 = uVar13 + 1;
  goto LAB_00240b7b;
LAB_00240aeb:
  if (uVar9 < uVar4) goto LAB_00240ba4;
  goto LAB_00240bb9;
LAB_002407f2:
  if (local_50 <= uVar13) goto joined_r0x00240ba2;
  bVar11 = pcVar14[uVar15 + 1 + uVar13];
  bVar2 = bVar11 | 0x20;
  if (0x19 < (byte)(bVar11 + 0xbf)) {
    bVar2 = bVar11;
  }
  bVar17 = StringUtil::CharacterIsHex(bVar2);
  if (!bVar17) goto LAB_00240bb9;
  cVar10 = -0x30;
  if ('`' < (char)bVar2) {
    cVar10 = -0x57;
  }
  uVar8 = local_50;
  if ((uVar5 - uVar13) - 2 != uVar15) {
    if (pcVar14[uVar15 + 2 + uVar13] == '_') {
      local_48 = uVar13;
      if (((uVar5 - uVar13) - 3 == uVar15) ||
         (bVar17 = StringUtil::CharacterIsHex(pcVar14[uVar15 + 3 + uVar13]), !bVar17))
      goto LAB_00240bb9;
      uVar8 = local_48 + 2;
    }
    else {
      uVar8 = uVar13 + 1;
    }
  }
  if ((char)(cVar10 + bVar2 ^ 0x7f) / '\x10' < (char)bVar3) goto LAB_00240bb9;
  bVar3 = cVar10 + bVar2 + bVar3 * '\x10';
  uVar13 = uVar8;
  goto LAB_002407f2;
joined_r0x00240ba2:
  if (uVar13 < 2) goto LAB_00240bb9;
LAB_00240ba4:
  *local_58 = bVar3;
  goto LAB_002411b3;
LAB_00240c0d:
  uVar13 = uVar9;
  if (uVar8 <= uVar13) goto LAB_00240e89;
  bVar3 = pcVar14[uVar15 + uVar13];
  bVar11 = bVar3 - 0x30;
  if (9 < bVar11) {
    if (bVar3 != 0x2e) goto LAB_0024100a;
    if (local_88 != 0) goto LAB_002413a7;
    uVar9 = uVar13 + 1;
    local_78.decimal_digits = 0;
    uVar4 = uVar9;
    local_78.decimal = 0;
    goto LAB_00240ed3;
  }
  uVar9 = (0x8000000000000000 - (ulong)bVar11) / 10;
  if (SBORROW8(local_78.result,-uVar9) != (long)(local_78.result + uVar9) < 0) {
    return false;
  }
  local_78.result = local_78.result * 10 - (ulong)bVar11;
  uVar9 = uVar8;
  if ((~uVar13 + uVar5 != uVar15) &&
     (uVar9 = uVar13 + 1, pcVar14[uVar15 + 1 + uVar13] == '_' && local_88 == 0)) {
    if ((uVar5 - uVar13) - 2 == uVar15) goto LAB_002413a7;
    uVar9 = uVar13 + 2;
    if (9 < (byte)(pcVar14[uVar15 + 2 + uVar13] - 0x30U)) {
      return false;
    }
  }
  goto LAB_00240c0d;
LAB_00240ed3:
  uVar7 = uVar4;
  if (uVar8 <= uVar7) {
    bVar17 = 1 < uVar13;
    local_78._18_6_ = 0;
    uVar13 = uVar7;
    if (uVar9 < uVar7 || bVar17) goto LAB_00240e89;
    goto LAB_002413a7;
  }
  bVar3 = pcVar14[uVar15 + uVar7];
  bVar11 = bVar3 - 0x30;
  if (9 < bVar11) {
    bVar17 = 1 < uVar13;
    local_78._18_6_ = 0;
    uVar13 = uVar7;
    if (uVar9 < uVar7 || bVar17) goto LAB_0024100a;
    goto LAB_002413a7;
  }
  uVar4 = ((ulong)bVar11 ^ 0x7ffffffffffffffe) / 10;
  lVar12 = local_78.decimal * 10 + (ulong)bVar11;
  if ((long)uVar4 < local_78.decimal) {
    lVar12 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar4);
  uVar4 = uVar8;
  local_78.decimal = lVar12;
  if ((~uVar7 + uVar5 != uVar15) && (uVar4 = uVar7 + 1, pcVar14[uVar15 + 1 + uVar7] == '_')) {
    if ((uVar5 - uVar7) - 2 == uVar15) goto LAB_002413a7;
    uVar4 = uVar7 + 2;
    if (9 < (byte)(pcVar14[uVar15 + 2 + uVar7] - 0x30U)) {
      return false;
    }
  }
  goto LAB_00240ed3;
LAB_0024100a:
  uVar1 = (uint)bVar3;
  if (4 < uVar1 - 9) {
    if ((uVar1 == 0x65) || (uVar1 == 0x45)) {
      if ((uVar13 != 1 && local_88 == 0) && (uVar13 + 1 < uVar8)) {
        exponent.result = 0;
        pcVar14 = pcVar14 + uVar15 + uVar13 + 1;
        iVar16 = ~uVar15 + (uVar5 - uVar13);
        if (*pcVar14 == '-') {
          bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar14,iVar16,&exponent,false);
        }
        else {
          bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar14,iVar16,&exponent,false);
        }
        if (bVar17 != false) {
          bVar17 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,true>
                             (&local_78,exponent.result);
          goto joined_r0x002411a2;
        }
      }
    }
    else if (uVar1 == 0x20) goto LAB_00241019;
    goto LAB_002413a7;
  }
LAB_00241019:
  uVar5 = uVar13 + 1;
  uVar13 = uVar5;
  if (uVar5 < uVar8) {
    uVar13 = uVar8;
  }
  for (; uVar5 < uVar8; uVar5 = uVar5 + 1) {
    if ((0x20 < (ulong)(byte)pcVar14[uVar15 + uVar5]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar15 + uVar5] & 0x3f) & 1) == 0))
    goto LAB_002413a7;
  }
LAB_00240e89:
  bVar17 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                     (&local_78);
  if (!bVar17) {
    return false;
  }
  if (uVar13 < 2) {
    return false;
  }
  goto LAB_002411a8;
LAB_00240f87:
  if (~uVar15 + uVar5 <= uVar8) goto LAB_0024113f;
  uVar9 = 0;
  if ((pcVar14[uVar15 + 1 + uVar8] != '0') && (uVar9 = 1, pcVar14[uVar15 + 1 + uVar8] != '1')) {
    return false;
  }
  uVar13 = ~uVar15 + uVar5;
  if ((uVar5 - uVar8) - 2 != uVar15) {
    if (pcVar14[uVar15 + 2 + uVar8] == '_') {
      if (((uVar5 - uVar8) - 3 == uVar15) || ((pcVar14[uVar15 + 3 + uVar8] & 0xfeU) != 0x30))
      goto LAB_002413a7;
      uVar13 = uVar8 + 2;
    }
    else {
      uVar13 = uVar8 + 1;
    }
  }
  uVar8 = uVar13;
  if (0x3fffffffffffffff < local_78.result) goto LAB_002413a7;
  local_78.result = uVar9 + local_78.result * 2;
  goto LAB_00240f87;
LAB_0024113f:
  bVar17 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                     (&local_78);
  goto LAB_0024119d;
LAB_00240cfa:
  if (~uVar15 + uVar5 <= uVar8) goto LAB_0024118c;
  bVar3 = pcVar14[uVar15 + 1 + uVar8];
  bVar11 = bVar3 | 0x20;
  if (0x19 < (byte)(bVar3 + 0xbf)) {
    bVar11 = bVar3;
  }
  bVar17 = StringUtil::CharacterIsHex(bVar11);
  if (!bVar17) goto LAB_002413a7;
  cVar10 = -0x30;
  if ('`' < (char)bVar11) {
    cVar10 = -0x57;
  }
  uVar9 = ~uVar15 + uVar5;
  if ((uVar5 - uVar8) - 2 != uVar15) {
    if (pcVar14[uVar15 + 2 + uVar8] == '_') {
      if (((uVar5 - uVar8) - 3 == uVar15) ||
         (bVar17 = StringUtil::CharacterIsHex(pcVar14[uVar15 + 3 + uVar8]), !bVar17))
      goto LAB_002413a7;
      uVar9 = uVar8 + 2;
    }
    else {
      uVar9 = uVar8 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar10 + bVar11) >> 4) ^ 0x7ffffffffffffff) < lVar12) goto LAB_002413a7;
  lVar12 = lVar12 * 0x10 + (ulong)(byte)(cVar10 + bVar11);
  uVar8 = uVar9;
  goto LAB_00240cfa;
LAB_00240deb:
  uVar4 = uVar13;
  if (uVar8 <= uVar4) goto LAB_0024105c;
  bVar3 = pcVar14[uVar15 + uVar4];
  bVar11 = bVar3 - 0x30;
  if (9 < bVar11) {
    if (bVar3 != 0x2e) goto LAB_002411bd;
    if (local_88 != 0) goto LAB_002413a7;
    uVar13 = uVar4 + 1;
    local_78.decimal_digits = 0;
    uVar7 = uVar13;
    local_78.decimal = 0;
    goto LAB_002410a6;
  }
  if ((long)(((ulong)bVar11 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
    return false;
  }
  local_78.result = local_78.result * 10 + (ulong)bVar11;
  uVar13 = uVar8;
  if ((~uVar4 + uVar5 != uVar15) &&
     (uVar13 = uVar4 + 1, pcVar14[uVar15 + 1 + uVar4] == '_' && local_88 == 0)) {
    if ((uVar5 - uVar4) - 2 == uVar15) goto LAB_002413a7;
    uVar13 = uVar4 + 2;
    if (9 < (byte)(pcVar14[uVar15 + 2 + uVar4] - 0x30U)) {
      return false;
    }
  }
  goto LAB_00240deb;
LAB_002410a6:
  uVar6 = uVar7;
  if (uVar8 <= uVar6) {
    bVar17 = uVar9 < uVar4;
    local_78._18_6_ = 0;
    uVar4 = uVar6;
    if (uVar13 < uVar6 || bVar17) goto LAB_0024105c;
    goto LAB_002413a7;
  }
  bVar3 = pcVar14[uVar15 + uVar6];
  bVar11 = bVar3 - 0x30;
  if (9 < bVar11) {
    bVar17 = uVar9 < uVar4;
    local_78._18_6_ = 0;
    uVar4 = uVar6;
    if (uVar13 < uVar6 || bVar17) goto LAB_002411bd;
    goto LAB_002413a7;
  }
  uVar7 = ((ulong)bVar11 ^ 0x7ffffffffffffffe) / 10;
  lVar12 = local_78.decimal * 10 + (ulong)bVar11;
  if ((long)uVar7 < local_78.decimal) {
    lVar12 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar7);
  uVar7 = uVar8;
  local_78.decimal = lVar12;
  if ((~uVar6 + uVar5 != uVar15) && (uVar7 = uVar6 + 1, pcVar14[uVar15 + 1 + uVar6] == '_')) {
    if ((uVar5 - uVar6) - 2 == uVar15) goto LAB_002413a7;
    uVar7 = uVar6 + 2;
    if (9 < (byte)(pcVar14[uVar15 + 2 + uVar6] - 0x30U)) {
      return false;
    }
  }
  goto LAB_002410a6;
LAB_002411bd:
  uVar1 = (uint)bVar3;
  if (uVar1 - 9 < 5) {
LAB_002411cc:
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar8) {
      uVar4 = uVar8;
    }
    for (; uVar5 < uVar8; uVar5 = uVar5 + 1) {
      if ((0x20 < (ulong)(byte)pcVar14[uVar15 + uVar5]) ||
         ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar15 + uVar5] & 0x3f) & 1) == 0))
      goto LAB_002413a7;
    }
LAB_0024105c:
    bVar17 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>(&local_78);
    if (!bVar17) {
      return false;
    }
    if (uVar4 <= uVar9) {
      return false;
    }
    goto LAB_002411a8;
  }
  if ((uVar1 == 0x65) || (uVar1 == 0x45)) {
    if ((uVar4 == uVar9 || local_88 != 0) || (uVar8 <= uVar4 + 1)) goto LAB_002413a7;
    exponent.result = 0;
    pcVar14 = pcVar14 + uVar15 + uVar4 + 1;
    iVar16 = ~uVar15 + (uVar5 - uVar4);
    if (*pcVar14 == '-') {
      bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar14,iVar16,&exponent,false);
    }
    else {
      bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar14,iVar16,&exponent,false);
    }
    if (bVar17 == false) goto LAB_002413a7;
    bVar17 = IntegerDecimalCastOperation::
             HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,false>
                       (&local_78,exponent.result);
    goto joined_r0x002411a2;
  }
  if (uVar1 == 0x20) goto LAB_002411cc;
  goto LAB_002413a7;
LAB_0024118c:
  local_78.result = lVar12;
  bVar17 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                     (&local_78);
LAB_0024119d:
  bVar17 = (bool)(1 < uVar8 & bVar17);
joined_r0x002411a2:
  if (bVar17 == false) {
LAB_002413a7:
    bVar17 = false;
  }
  else {
LAB_002411a8:
    *local_58 = (byte)local_78.result;
LAB_002411b3:
    bVar17 = true;
  }
  return bVar17;
}

Assistant:

bool TryCast::Operation(string_t input, int8_t &result, bool strict) {
	return TrySimpleIntegerCast<int8_t>(input.GetData(), input.GetSize(), result, strict);
}